

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::SmokeTest::getPixels
          (SmokeTest *this,GLuint name,testCase *test_case,GLubyte *out_pixels)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLenum local_38;
  GLenum local_34;
  GLenum tgt_get;
  GLenum tgt_bind;
  Functions *gl;
  GLubyte *out_pixels_local;
  testCase *test_case_local;
  GLuint name_local;
  SmokeTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  local_34 = test_case->m_target;
  local_38 = test_case->m_target;
  if (test_case->m_target == 0x8d41) {
    local_34 = 0xde1;
    local_38 = 0xde1;
  }
  else if (test_case->m_target == 0x8513) {
    local_38 = 0x8515;
  }
  (**(code **)(lVar4 + 0xb8))(local_34,name);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xfa4);
  (**(code **)(lVar4 + 0xaa0))(local_38,0,test_case->m_format,test_case->m_type,out_pixels);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xfa7);
  (**(code **)(lVar4 + 0xb8))(local_34,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xfaa);
  return;
}

Assistant:

void SmokeTest::getPixels(GLuint name, const SmokeTest::testCase& test_case, GLubyte* out_pixels) const
{
	const Functions& gl		  = m_context.getRenderContext().getFunctions();
	GLenum			 tgt_bind = test_case.m_target;
	GLenum			 tgt_get  = test_case.m_target;

	if (GL_RENDERBUFFER == test_case.m_target)
	{
		tgt_bind = GL_TEXTURE_2D;
		tgt_get  = GL_TEXTURE_2D;
	}
	else if (GL_TEXTURE_CUBE_MAP == test_case.m_target)
	{
		tgt_get = GL_TEXTURE_CUBE_MAP_POSITIVE_X;
	}

	gl.bindTexture(tgt_bind, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.getTexImage(tgt_get, 0 /* level */, test_case.m_format, test_case.m_type, out_pixels);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

	gl.bindTexture(tgt_bind, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}